

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

TimerId __thiscall
sznet::TimerQueue::addTimer(TimerQueue *this,TimerCallback *cb,Timestamp when,double interval)

{
  EventLoop *this_00;
  long lVar1;
  TimerId TVar2;
  _Any_data local_78;
  code *pcStack_68;
  code *pcStack_60;
  _Any_data local_50;
  _Manager_type local_40;
  _Invoker_type p_Stack_38;
  double local_30;
  
  local_30 = interval;
  TVar2.m_timer = (Timer *)operator_new(0x48);
  std::function<void_()>::function((function<void_()> *)&local_50,cb);
  ((TVar2.m_timer)->super_MinHeaBaseElem).min_heap_idx = -1;
  *(undefined8 *)&((TVar2.m_timer)->m_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&((TVar2.m_timer)->m_callback).super__Function_base._M_functor + 8) = 0;
  ((TVar2.m_timer)->m_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  ((TVar2.m_timer)->m_callback)._M_invoker = p_Stack_38;
  if (local_40 != (_Manager_type)0x0) {
    *(void **)&((TVar2.m_timer)->m_callback).super__Function_base._M_functor =
         local_50._M_unused._M_object;
    *(undefined8 *)((long)&((TVar2.m_timer)->m_callback).super__Function_base._M_functor + 8) =
         local_50._8_8_;
    ((TVar2.m_timer)->m_callback).super__Function_base._M_manager = local_40;
    local_40 = (_Manager_type)0x0;
    p_Stack_38 = (_Invoker_type)0x0;
  }
  ((TVar2.m_timer)->m_expiration).m_microSecondsSinceEpoch = when.m_microSecondsSinceEpoch;
  (TVar2.m_timer)->m_interval = local_30;
  (TVar2.m_timer)->m_repeat = 0.0 < local_30;
  LOCK();
  UNLOCK();
  lVar1 = Timer::m_s_numCreated + 1;
  (TVar2.m_timer)->m_sequence = Timer::m_s_numCreated;
  Timer::m_s_numCreated = lVar1;
  if (local_40 != (_Manager_type)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  this_00 = this->m_loop;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  pcStack_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x20);
  *(code **)local_78._M_unused._0_8_ = addTimerInLoop;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(Timer **)((long)local_78._M_unused._0_8_ + 0x10) = TVar2.m_timer;
  *(TimerQueue **)((long)local_78._M_unused._0_8_ + 0x18) = this;
  pcStack_60 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::TimerQueue::*(sznet::TimerQueue_*,_sznet::Timer_*))(sznet::Timer_*)>_>
               ::_M_invoke;
  pcStack_68 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::TimerQueue::*(sznet::TimerQueue_*,_sznet::Timer_*))(sznet::Timer_*)>_>
               ::_M_manager;
  net::EventLoop::runInLoop(this_00,(Functor *)&local_78);
  if (pcStack_68 != (code *)0x0) {
    (*pcStack_68)(&local_78,&local_78,__destroy_functor);
  }
  TVar2.m_sequence = (TVar2.m_timer)->m_sequence;
  return TVar2;
}

Assistant:

TimerId TimerQueue::addTimer(const net::TimerCallback cb, Timestamp when, double interval)
{
	Timer* timer = new Timer(cb, when, interval);
	m_loop->runInLoop(std::bind(&TimerQueue::addTimerInLoop, this, timer));
	return TimerId(timer, timer->sequence());
}